

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_c_glib_generator.cc
# Opt level: O3

void __thiscall t_c_glib_generator::generate_xception(t_c_glib_generator *this,t_struct *tstruct)

{
  ofstream_with_content_based_conditional_update *poVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  undefined4 extraout_var;
  ostream *poVar5;
  string name_uc;
  string name_lc;
  string name_u;
  string name;
  string local_128;
  string local_108;
  string local_e8;
  char *local_c8;
  long local_c0;
  char local_b8 [16];
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  iVar4 = (*(tstruct->super_t_type).super_t_doc._vptr_t_doc[3])(tstruct);
  lVar3 = *(long *)CONCAT44(extraout_var,iVar4);
  local_c8 = local_b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,lVar3,((long *)CONCAT44(extraout_var,iVar4))[1] + lVar3);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_c8,local_c8 + local_c0);
  initial_caps_to_underscores(&local_e8,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,local_e8._M_dataplus._M_p,
             local_e8._M_dataplus._M_p + local_e8._M_string_length);
  to_lower_case(&local_108,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p);
  }
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_88,local_e8._M_dataplus._M_p,
             local_e8._M_dataplus._M_p + local_e8._M_string_length);
  to_upper_case(&local_128,&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != &local_88.field_2) {
    operator_delete(local_88._M_dataplus._M_p);
  }
  generate_object(this,tstruct);
  poVar1 = &this->f_types_;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"/* exception */",0xf);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"typedef enum",0xc);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + 1;
  t_generator::indent_abi_cxx11_(&local_a8,(t_generator *)this);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,local_a8._M_dataplus._M_p,local_a8._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->nspace_uc)._M_dataplus._M_p,(this->nspace_uc)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_128._M_dataplus._M_p,local_128._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_ERROR_CODE",0xb);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p);
  }
  piVar2 = &(this->super_t_oop_generator).super_t_generator.indent_;
  *piVar2 = *piVar2 + -1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"} ",2);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)poVar1,(this->nspace)._M_dataplus._M_p,
                      (this->nspace)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>(poVar5,local_c8,local_c0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"Error;",6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"GQuark ",7);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->nspace_lc)._M_dataplus._M_p,(this->nspace_lc)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_108._M_dataplus._M_p,local_108._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_error_quark (void);",0x14);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"#define ",8);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->nspace_uc)._M_dataplus._M_p,(this->nspace_uc)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_128._M_dataplus._M_p,local_128._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_ERROR (",8);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->nspace_lc)._M_dataplus._M_p,(this->nspace_lc)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_108._M_dataplus._M_p,local_108._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_error_quark())",0xf);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->f_types_impl_,"/* define the GError domain for exceptions */",0x2d);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&this->f_types_impl_,::endl_abi_cxx11_._M_dataplus._M_p,
                      ::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"#define ",8);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->nspace_uc)._M_dataplus._M_p,(this->nspace_uc)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_128._M_dataplus._M_p,local_128._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_ERROR_DOMAIN \"",0xf);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->nspace_lc)._M_dataplus._M_p,(this->nspace_lc)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_108._M_dataplus._M_p,local_108._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_error_quark\"",0xd);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"GQuark",6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->nspace_lc)._M_dataplus._M_p,(this->nspace_lc)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_108._M_dataplus._M_p,local_108._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_error_quark (void)",0x13);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"{",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,"  return g_quark_from_static_string (",0x25);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(this->nspace_uc)._M_dataplus._M_p,(this->nspace_uc)._M_string_length);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,local_128._M_dataplus._M_p,local_128._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"_ERROR_DOMAIN);",0xf);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"}",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar5,::endl_abi_cxx11_._M_dataplus._M_p,::endl_abi_cxx11_._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
    operator_delete(local_e8._M_dataplus._M_p);
  }
  if (local_c8 != local_b8) {
    operator_delete(local_c8);
  }
  return;
}

Assistant:

void t_c_glib_generator::generate_xception(t_struct* tstruct) {
  string name = tstruct->get_name();
  string name_u = initial_caps_to_underscores(name);
  string name_lc = to_lower_case(name_u);
  string name_uc = to_upper_case(name_u);

  generate_object(tstruct);

  f_types_ << "/* exception */" << endl
           << "typedef enum" << endl
           << "{" << endl;
  indent_up();
  f_types_ << indent() << this->nspace_uc << name_uc << "_ERROR_CODE" << endl;
  indent_down();
  f_types_ << "} " << this->nspace << name << "Error;" << endl
           << endl
           << "GQuark " << this->nspace_lc << name_lc
           << "_error_quark (void);" << endl
           << "#define " << this->nspace_uc << name_uc << "_ERROR ("
           << this->nspace_lc << name_lc << "_error_quark())" << endl
           << endl
           << endl;

  f_types_impl_ << "/* define the GError domain for exceptions */" << endl << "#define "
                << this->nspace_uc << name_uc << "_ERROR_DOMAIN \"" << this->nspace_lc << name_lc
                << "_error_quark\"" << endl << "GQuark" << endl << this->nspace_lc << name_lc
                << "_error_quark (void)" << endl << "{" << endl
                << "  return g_quark_from_static_string (" << this->nspace_uc << name_uc
                << "_ERROR_DOMAIN);" << endl << "}" << endl << endl;
}